

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_zip_entry_read(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  long lVar2;
  uint nLen;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) || (lVar1 = ((*apArg)->x).iVal, lVar1 == 0)
      ) || (*(int *)(lVar1 + 0xa0) != -0x21529ca6)) {
    jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive entry");
  }
  else {
    uVar3 = *(uint *)(lVar1 + 4);
    uVar4 = *(uint *)(lVar1 + 8);
    if (uVar4 < uVar3) {
      uVar5 = 0x400;
      if (nArg != 1) {
        uVar3 = jx9_value_to_int(apArg[1]);
        uVar5 = 0x400;
        if (0 < (int)uVar3) {
          uVar5 = uVar3;
        }
        uVar3 = *(uint *)(lVar1 + 4);
        uVar4 = *(uint *)(lVar1 + 8);
      }
      nLen = uVar3 - uVar4;
      if (uVar5 < uVar3 - uVar4) {
        nLen = uVar5;
      }
      lVar2 = *(long *)(*(int **)(lVar1 + 0x98) + (ulong)(**(int **)(lVar1 + 0x98) == 2) * 2 + 2);
      *(uint *)(lVar1 + 8) = nLen + uVar4;
      jx9_result_string(pCtx,(char *)((ulong)(uVar4 + *(int *)(lVar1 + 0x48)) + lVar2),nLen);
      return 0;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_read(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	zip_raw_data *pRaw;
	const char *zData;
	int iLength;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[0]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zData = 0;
	if( pEntry->nReadCount >= pEntry->nByteCompr ){
		/* No more data to read, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Set a default read length */
	iLength = 1024;
	if( nArg > 1 ){
		iLength = jx9_value_to_int(apArg[1]);
		if( iLength < 1 ){
			iLength = 1024;
		}
	}
	if( (sxu32)iLength > pEntry->nByteCompr - pEntry->nReadCount ){
		iLength = (int)(pEntry->nByteCompr - pEntry->nReadCount);
	}
	/* Return the entry contents */
	pRaw = (zip_raw_data *)pEntry->pUserData;
	if( pRaw->iType == ZIP_RAW_DATA_MEMBUF ){
		zData = (const char *)SyBlobDataAt(&pRaw->raw.sBlob, (pEntry->nOfft+pEntry->nReadCount));
	}else{
		const char *zMap = (const char *)pRaw->raw.mmap.pMap;
		/* Memory mmaped chunk */
		zData = &zMap[pEntry->nOfft+pEntry->nReadCount];
	}
	/* Increment the read counter */
	pEntry->nReadCount += iLength;
	/* Return the raw data */
	jx9_result_string(pCtx, zData, iLength);
	return JX9_OK;
}